

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

value_type __thiscall
andres::
BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
::operator()(BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
             *this,int it)

{
  reference piVar1;
  reference piVar2;
  int local_20;
  int local_1c;
  
  local_20 = it;
  piVar1 = marray_detail::AccessOperatorHelper<true>::
           execute<int,int,true,std::allocator<unsigned_long>>
                     (*(View<int,_true,_std::allocator<unsigned_long>_> **)this,&local_20);
  local_1c = it;
  piVar2 = marray_detail::AccessOperatorHelper<true>::
           execute<int,int,true,std::allocator<unsigned_long>>
                     (*(View<int,_true,_std::allocator<unsigned_long>_> **)(this + 8),&local_1c);
  return *piVar2 * *piVar1;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }